

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O2

Globals * __thiscall
OpenMD::SimCreator::parseFile
          (SimCreator *this,istream *rawMetaDataStream,string *filename,int mdFileVersion,
          int startOfMetaDataBlock)

{
  Globals *pGVar1;
  int tmp;
  SimplePreprocessor preprocessor;
  MDParser parser;
  FilenameObserver observer;
  ASTFactory factory;
  MDLexer lexer;
  stringstream ppStream;
  MDTreeParser treeParser;
  SimplePreprocessor local_349;
  RefAST local_348;
  MDParser local_340;
  FilenameObserver local_318;
  ASTFactory local_308;
  MDLexer local_2d8;
  undefined1 local_240 [392];
  MDTreeParser local_b8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_240);
  SimplePreprocessor::preprocess
            (&local_349,rawMetaDataStream,filename,startOfMetaDataBlock,
             (ostream *)(local_240 + 0x10));
  MDLexer::MDLexer(&local_2d8,(istream *)local_240);
  antlr::CharScanner::setFilename(&local_2d8.super_CharScanner,filename);
  local_2d8.super_CharScanner._140_4_ = 0;
  MDParser::MDParser(&local_340,(TokenStream *)&local_2d8);
  antlr::Parser::setFilename((Parser *)&local_340,filename);
  FilenameObserver::FilenameObserver(&local_318);
  FilenameObserver::setLexer(&local_318,&local_2d8);
  FilenameObserver::setParser(&local_318,&local_340);
  local_2d8.observer = &local_318;
  antlr::ASTFactory::ASTFactory(&local_308);
  MDParser::initializeASTFactory(&local_340,&local_308);
  local_340.super_LLkParser.super_Parser.astFactory = &local_308;
  MDParser::mdfile(&local_340);
  MDTreeParser::MDTreeParser(&local_b8);
  MDTreeParser::initializeASTFactory(&local_308);
  if (local_340.returnAST.ref != (ASTRef *)0x0) {
    (local_340.returnAST.ref)->count = (local_340.returnAST.ref)->count + 1;
  }
  local_348.ref = local_340.returnAST.ref;
  local_b8.super_TreeParser.astFactory = &local_308;
  pGVar1 = MDTreeParser::walkTree(&local_b8,&local_348);
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount(&local_348);
  MDTreeParser::~MDTreeParser(&local_b8);
  antlr::ASTFactory::~ASTFactory(&local_308);
  MDParser::~MDParser(&local_340);
  antlr::CharScanner::~CharScanner(&local_2d8.super_CharScanner);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_240);
  (pGVar1->MDfileVersion).super_ParameterBase.empty_ = false;
  *(int *)&(pGVar1->MDfileVersion).super_ParameterBase.field_0x2c = mdFileVersion;
  return pGVar1;
}

Assistant:

Globals* SimCreator::parseFile(std::istream& rawMetaDataStream,
                                 const std::string& filename, int mdFileVersion,
                                 int startOfMetaDataBlock) {
    Globals* simParams = NULL;
    try {
      // Create a preprocessor that preprocesses md file into an ostringstream
      std::stringstream ppStream;
#ifdef IS_MPI
      int streamSize;
      const int primaryNode = 0;

      if (worldRank == primaryNode) {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
#endif
        SimplePreprocessor preprocessor;
        preprocessor.preprocess(rawMetaDataStream, filename,
                                startOfMetaDataBlock, ppStream);

#ifdef IS_MPI
        // broadcasting the stream size
        streamSize = ppStream.str().size() + 1;
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        MPI_Bcast(static_cast<void*>(const_cast<char*>(ppStream.str().c_str())),
                  streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);
      } else {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // get stream size
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        char* buf = new char[streamSize];
        assert(buf);

        // receive file content
        MPI_Bcast(buf, streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);

        ppStream.str(buf);
        delete[] buf;
      }
#endif
      // Create a scanner that reads from the input stream
      MDLexer lexer(ppStream);
      lexer.setFilename(filename);
      lexer.initDeferredLineCount();

      // Create a parser that reads from the scanner
      MDParser parser(lexer);
      parser.setFilename(filename);

      // Create an observer that synchorizes file name change
      FilenameObserver observer;
      observer.setLexer(&lexer);
      observer.setParser(&parser);
      lexer.setObserver(&observer);
      antlr::ASTFactory factory;
      parser.initializeASTFactory(factory);
      parser.setASTFactory(&factory);
      parser.mdfile();
      // Create a tree parser that reads information into Globals
      MDTreeParser treeParser;
      treeParser.initializeASTFactory(factory);
      treeParser.setASTFactory(&factory);
      simParams = treeParser.walkTree(parser.getAST());
    }

    catch (antlr::MismatchedCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Character: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::MismatchedTokenException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Token: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltForCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative for Character: %s in file %s at line %d, "
               "column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamRecognitionException& e) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Token Stream Recognition: %s in file %s at line %d, column %d\n",
          e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
          e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamIOException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream IO exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::RecognitionException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Recognition exception: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::CharStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Character Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s\n", e.what());
      painCave.isFatal = 1;
      simError();
    } catch (std::exception& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "parser exception: %s\n", e.what());
      painCave.isFatal = 1;
      simError();
    }

    simParams->setMDfileVersion(mdFileVersion);
    return simParams;
  }